

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O1

Vec_Wec_t * Abc_NtkDetectObjClasses(Abc_Ntk_t *pNtk,Vec_Int_t *vObjs,Vec_Wec_t **pvCos)

{
  Abc_Obj_t *pObj;
  Vec_Int_t *pVVar1;
  uint uVar2;
  int iVar3;
  Hsh_VecMan_t *p;
  Vec_Int_t *pVVar4;
  int *piVar5;
  Vec_Int_t *pVVar6;
  Vec_Ptr_t *pVVar7;
  void *pvVar8;
  Vec_Wec_t *p_00;
  long lVar9;
  Vec_Wec_t *pVVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  
  p = (Hsh_VecMan_t *)calloc(1,0x48);
  uVar13 = 999;
  while( true ) {
    do {
      uVar12 = uVar13;
      uVar13 = uVar12 + 1;
    } while ((uVar12 & 1) != 0);
    if (uVar13 < 9) break;
    iVar11 = 5;
    while (uVar13 % (iVar11 - 2U) != 0) {
      uVar2 = iVar11 * iVar11;
      iVar11 = iVar11 + 2;
      if (uVar13 < uVar2) goto LAB_002a65ef;
    }
  }
LAB_002a65ef:
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  uVar2 = uVar13;
  if (uVar12 < 0xf) {
    uVar2 = 0x10;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = uVar2;
  piVar5 = (int *)malloc((long)(int)uVar2 << 2);
  pVVar4->pArray = piVar5;
  pVVar4->nSize = uVar13;
  if (piVar5 != (int *)0x0) {
    memset(piVar5,0xff,(long)(int)uVar13 << 2);
  }
  p->vTable = pVVar4;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 4000;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(16000);
  pVVar4->pArray = piVar5;
  p->vData = pVVar4;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 1000;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(4000);
  pVVar4->pArray = piVar5;
  p->vMap = pVVar4;
  iVar11 = pNtk->vObjs->nSize;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  iVar3 = 0x10;
  if (0xe < iVar11 - 1U) {
    iVar3 = iVar11;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar3;
  if (iVar3 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar3 << 2);
  }
  pVVar4->pArray = piVar5;
  pVVar4->nSize = iVar11;
  if (piVar5 != (int *)0x0) {
    memset(piVar5,0xff,(long)iVar11 << 2);
  }
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 0x10;
  pVVar6->nSize = 0;
  piVar5 = (int *)malloc(0x40);
  pVVar6->pArray = piVar5;
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDetect.c"
                  ,0x193,
                  "Vec_Wec_t *Abc_NtkDetectObjClasses(Abc_Ntk_t *, Vec_Int_t *, Vec_Wec_t **)");
  }
  iVar11 = Hsh_VecManAdd(p,pVVar6);
  if (iVar11 != 0) {
    __assert_fail("SetId == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDetect.c"
                  ,0x196,
                  "Vec_Wec_t *Abc_NtkDetectObjClasses(Abc_Ntk_t *, Vec_Int_t *, Vec_Wec_t **)");
  }
  pVVar7 = pNtk->vCos;
  if (0 < pVVar7->nSize) {
    lVar15 = 0;
    do {
      pvVar8 = pVVar7->pArray[lVar15];
      iVar11 = *(int *)((long)pvVar8 + 0x10);
      if (pVVar6->nCap < 1) {
        if (pVVar6->pArray == (int *)0x0) {
          piVar5 = (int *)malloc(4);
        }
        else {
          piVar5 = (int *)realloc(pVVar6->pArray,4);
        }
        pVVar6->pArray = piVar5;
        if (piVar5 == (int *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        pVVar6->nCap = 1;
      }
      *pVVar6->pArray = iVar11;
      pVVar6->nSize = 1;
      iVar3 = Hsh_VecManAdd(p,pVVar6);
      iVar11 = *(int *)((long)pvVar8 + 0x10);
      if (((long)iVar11 < 0) || (pVVar4->nSize <= iVar11)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      pVVar4->pArray[iVar11] = iVar3;
      lVar15 = lVar15 + 1;
      pVVar7 = pNtk->vCos;
    } while (lVar15 < pVVar7->nSize);
  }
  qsort(vObjs->pArray,(long)vObjs->nSize,4,Vec_IntSortCompare1);
  if (0 < vObjs->nSize) {
    lVar15 = 0;
    do {
      iVar11 = vObjs->pArray[lVar15];
      if (((long)iVar11 < 0) || (pNtk->vObjs->nSize <= iVar11)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pObj = (Abc_Obj_t *)pNtk->vObjs->pArray[iVar11];
      if (pObj != (Abc_Obj_t *)0x0) {
        Abc_NtkDetectObjClasses_rec(pObj,pVVar4,p,pVVar6);
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < vObjs->nSize);
  }
  if (pVVar6->pArray != (int *)0x0) {
    free(pVVar6->pArray);
    pVVar6->pArray = (int *)0x0;
  }
  free(pVVar6);
  iVar11 = p->vMap->nSize;
  lVar15 = (long)iVar11 + 1;
  iVar3 = 0x10;
  if (0xe < (ulong)(long)iVar11) {
    iVar3 = (int)lVar15;
  }
  if (iVar3 == 0) {
    pvVar8 = (void *)0x0;
  }
  else {
    pvVar8 = malloc((long)iVar3 << 2);
  }
  if (pvVar8 != (void *)0x0) {
    memset(pvVar8,0xff,lVar15 * 4);
  }
  p_00 = (Vec_Wec_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  pVVar6 = (Vec_Int_t *)calloc(1000,0x10);
  p_00->pArray = pVVar6;
  if (0 < vObjs->nSize) {
    lVar15 = 0;
    do {
      iVar3 = vObjs->pArray[lVar15];
      if (((long)iVar3 < 0) || (pVVar4->nSize <= iVar3)) goto LAB_002a6b94;
      lVar9 = (long)pVVar4->pArray[iVar3];
      if (lVar9 < 0) {
        __assert_fail("SetId >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDetect.c"
                      ,0x1ac,
                      "Vec_Wec_t *Abc_NtkDetectObjClasses(Abc_Ntk_t *, Vec_Int_t *, Vec_Wec_t **)");
      }
      if (iVar11 < pVVar4->pArray[iVar3]) goto LAB_002a6b94;
      uVar13 = *(uint *)((long)pvVar8 + lVar9 * 4);
      if ((ulong)uVar13 == 0xffffffff) {
        *(int *)((long)pvVar8 + lVar9 * 4) = p_00->nSize;
        pVVar6 = Vec_WecPushLevel(p_00);
      }
      else {
        if (((int)uVar13 < 0) || (p_00->nSize <= (int)uVar13)) goto LAB_002a6bb3;
        pVVar6 = p_00->pArray + uVar13;
      }
      Vec_IntPush(pVVar6,iVar3);
      lVar15 = lVar15 + 1;
    } while (lVar15 < vObjs->nSize);
  }
  uVar13 = p_00->nSize;
  pVVar10 = (Vec_Wec_t *)malloc(0x10);
  uVar12 = 8;
  if (6 < uVar13 - 1) {
    uVar12 = uVar13;
  }
  pVVar10->nSize = 0;
  pVVar10->nCap = uVar12;
  if (uVar12 == 0) {
    pVVar6 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar6 = (Vec_Int_t *)calloc((long)(int)uVar12,0x10);
  }
  pVVar10->pArray = pVVar6;
  pVVar10->nSize = uVar13;
  *pvCos = pVVar10;
  if (0 < (int)uVar13) {
    pVVar6 = p_00->pArray;
    uVar14 = 0;
    do {
      if (pVVar6[uVar14].nSize < 1) {
LAB_002a6b94:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar11 = *pVVar6[uVar14].pArray;
      if (((long)iVar11 < 0) || (pVVar4->nSize <= iVar11)) goto LAB_002a6b94;
      iVar11 = pVVar4->pArray[iVar11];
      if ((long)iVar11 < 0) {
        __assert_fail("SetId >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDetect.c"
                      ,0x1c4,
                      "Vec_Wec_t *Abc_NtkDetectObjClasses(Abc_Ntk_t *, Vec_Int_t *, Vec_Wec_t **)");
      }
      if (p->vMap->nSize <= iVar11) goto LAB_002a6b94;
      iVar11 = p->vMap->pArray[iVar11];
      if (((long)iVar11 < 0) || (p->vData->nSize <= iVar11)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      piVar5 = p->vData->pArray + iVar11;
      iVar11 = *piVar5;
      (p->vTemp).nCap = iVar11;
      (p->vTemp).nSize = iVar11;
      (p->vTemp).pArray = piVar5 + 2;
      if ((long)(*pvCos)->nSize <= (long)uVar14) {
LAB_002a6bb3:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWec.h"
                      ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      if (0 < (p->vTemp).nSize) {
        pVVar1 = (*pvCos)->pArray;
        lVar15 = 0;
        do {
          Vec_IntPush(pVVar1 + uVar14,(p->vTemp).pArray[lVar15]);
          lVar15 = lVar15 + 1;
        } while (lVar15 < (p->vTemp).nSize);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar13);
  }
  pVVar6 = p->vTable;
  if (pVVar6->pArray != (int *)0x0) {
    free(pVVar6->pArray);
    pVVar6->pArray = (int *)0x0;
  }
  if (pVVar6 != (Vec_Int_t *)0x0) {
    free(pVVar6);
  }
  pVVar6 = p->vData;
  if (pVVar6->pArray != (int *)0x0) {
    free(pVVar6->pArray);
    pVVar6->pArray = (int *)0x0;
  }
  if (pVVar6 != (Vec_Int_t *)0x0) {
    free(pVVar6);
  }
  pVVar6 = p->vMap;
  if (pVVar6->pArray != (int *)0x0) {
    free(pVVar6->pArray);
    pVVar6->pArray = (int *)0x0;
  }
  if (pVVar6 != (Vec_Int_t *)0x0) {
    free(pVVar6);
  }
  free(p);
  if (pvVar8 != (void *)0x0) {
    free(pvVar8);
  }
  if (pVVar4->pArray != (int *)0x0) {
    free(pVVar4->pArray);
    pVVar4->pArray = (int *)0x0;
  }
  free(pVVar4);
  return p_00;
}

Assistant:

Vec_Wec_t * Abc_NtkDetectObjClasses( Abc_Ntk_t * pNtk, Vec_Int_t * vObjs, Vec_Wec_t ** pvCos )
{
    Vec_Wec_t * vClasses;   // classes of equivalence objects from vObjs
    Vec_Int_t * vClassMap;  // mapping of each CO set into its class in vClasses
    Vec_Int_t * vClass;     // one equivalence class     
    Abc_Obj_t * pObj; 
    int i, iObj, SetId, ClassId;
    // create hash table to hash sets of CO indexes
    Hsh_VecMan_t * pHash = Hsh_VecManStart( 1000 );
    // create elementary sets (each composed of one CO) and map COs into them
    Vec_Int_t * vMap = Vec_IntStartFull( Abc_NtkObjNumMax(pNtk) );
    Vec_Int_t * vSet = Vec_IntAlloc( 16 );
    assert( Abc_NtkIsLogic(pNtk) );
    // compute empty set
    SetId = Hsh_VecManAdd( pHash, vSet );
    assert( SetId == 0 );
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        Vec_IntFill( vSet, 1, Abc_ObjId(pObj) );
        SetId = Hsh_VecManAdd( pHash, vSet );
        Vec_IntWriteEntry( vMap, Abc_ObjId(pObj), SetId );
    }
    // make sure the array of objects is sorted
    Vec_IntSort( vObjs, 0 );
    // begin from the objects and map their IDs into sets of COs
    Abc_NtkForEachObjVec( vObjs, pNtk, pObj, i )
        Abc_NtkDetectObjClasses_rec( pObj, vMap, pHash, vSet );
    Vec_IntFree( vSet );
    // create map for mapping CO set its their classes
    vClassMap = Vec_IntStartFull( Hsh_VecSize(pHash) + 1 );
    // collect classes of objects
    vClasses = Vec_WecAlloc( 1000 );
    Vec_IntForEachEntry( vObjs, iObj, i )
    {
        //char * pName = Abc_ObjName( Abc_NtkObj(pNtk, iObj) );
        // for a given object (iObj), find the ID of its COs set
        SetId = Vec_IntEntry( vMap, iObj );
        assert( SetId >= 0 );
        // for the given CO set, finds its equivalence class
        ClassId = Vec_IntEntry( vClassMap, SetId );
        if ( ClassId == -1 )  // there is no equivalence class
        {
            // map this CO set into a new equivalence class
            Vec_IntWriteEntry( vClassMap, SetId, Vec_WecSize(vClasses) );
            vClass = Vec_WecPushLevel( vClasses );
        }
        else // get hold of the equivalence class
            vClass = Vec_WecEntry( vClasses, ClassId );
        // add objects to the class
        Vec_IntPush( vClass, iObj );
        // print the set for this object
        //printf( "Object %5d : ", iObj );
        //Vec_IntPrint( Hsh_VecReadEntry(pHash, SetId) );
    }
    // collect arrays of COs for each class
    *pvCos = Vec_WecStart( Vec_WecSize(vClasses) );
    Vec_WecForEachLevel( vClasses, vClass, i )
    {
        iObj = Vec_IntEntry( vClass, 0 );
        // for a given object (iObj), find the ID of its COs set
        SetId = Vec_IntEntry( vMap, iObj );
        assert( SetId >= 0 );
        // for the given CO set ID, find the set
        vSet = Hsh_VecReadEntry( pHash, SetId );
        Vec_IntAppend( Vec_WecEntry(*pvCos, i), vSet );
    }
    Hsh_VecManStop( pHash );
    Vec_IntFree( vClassMap );
    Vec_IntFree( vMap );
    return vClasses;
}